

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O2

void __thiscall
UnitTests::Assert::NotEquals<int,int>(Assert *this,string *msg,int *expected,int *actual)

{
  uint *puVar1;
  ostream *poVar2;
  ostringstream s;
  int local_1b4;
  string local_1b0;
  long local_190 [3];
  uint auStack_178 [88];
  
  if (*expected != *actual) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  if (msg->_M_string_length != 0) {
    local_1b0._M_dataplus._M_p = (pointer)msg;
    poVar2 = details::operator<<((ostream *)local_190,
                                 (expected_got_outputter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_1b0);
    std::operator<<(poVar2," ");
  }
  puVar1 = (uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18));
  *puVar1 = *puVar1 | 1;
  poVar2 = std::operator<<((ostream *)local_190,"Wasn\'t expecting to get <");
  local_1b4 = *actual;
  local_1b0._M_dataplus._M_p = (pointer)&local_1b4;
  poVar2 = details::operator<<(poVar2,(expected_got_outputter<int> *)&local_1b0);
  std::operator<<(poVar2,">");
  std::__cxx11::stringbuf::str();
  Error(this,&local_1b0);
}

Assistant:

void NotEquals(const std::string& msg, const T& expected, const U& actual) const
        {
            if (are_equal(std::common_type_t<T, U>(expected), std::common_type_t<T, U>(actual)))
            {
                auto s = std::ostringstream{};
                if (!msg.empty())
                    s << stream(msg) << " ";

                s << std::boolalpha;
                s << "Wasn't expecting to get <" << stream(std::common_type_t<T, U>(actual)) << ">";
                Error(s.str());
            }
        }